

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::FragmentShader::shadeFragments
          (FragmentShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  GenericVec4 *pGVar8;
  TextureChannelClass TVar9;
  int iVar10;
  int fragNdx;
  int fragNdx_00;
  FragmentPacket *packet;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  rr local_58 [8];
  undefined8 uStack_50;
  ulong local_48;
  FragmentPacket *local_40;
  ulong local_38;
  
  if (0 < numPackets) {
    local_48 = (ulong)(uint)numPackets;
    iVar11 = 0;
    local_38 = 0;
    local_40 = packets;
    do {
      packet = local_40 + local_38;
      fragNdx_00 = 0;
      do {
        rr::readVarying<float>(local_58,packet,context,0,fragNdx_00);
        uStack_50 = CONCAT44(1.0 - local_58._4_4_,1.0 - local_58._0_4_);
        TVar9 = tcu::getTextureChannelClass((this->m_info).m_format.type);
        switch(TVar9) {
        case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
        case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
        case TEXTURECHANNELCLASS_FLOATING_POINT:
          iVar7 = this->m_drawBufferNdx;
          uVar12 = iVar7 + 4;
          if (-1 < (int)(iVar7 + 1U)) {
            uVar12 = iVar7 + 1U;
          }
          dVar1 = *(deUint32 *)(local_58 + (long)(int)((iVar7 - (uVar12 & 0xfffffffc)) + 1) * 4);
          uVar12 = iVar7 + 5;
          if (-1 < (int)(iVar7 + 2U)) {
            uVar12 = iVar7 + 2U;
          }
          uVar13 = iVar7 + 6;
          if (-1 < (int)(iVar7 + 3U)) {
            uVar13 = iVar7 + 3U;
          }
          dVar2 = *(deUint32 *)(local_58 + (long)(int)((iVar7 - (uVar12 & 0xfffffffc)) + 2) * 4);
          dVar3 = *(deUint32 *)(local_58 + (long)(int)((iVar7 - (uVar13 & 0xfffffffc)) + 3) * 4);
          pGVar8 = context->outputArray;
          iVar10 = (iVar11 + fragNdx_00) * context->numFragmentOutputs;
          pGVar8[iVar10].v.uData[0] = *(deUint32 *)(local_58 + (long)(iVar7 % 4) * 4);
          pGVar8[iVar10].v.uData[1] = dVar1;
          pGVar8[iVar10].v.uData[2] = dVar2;
          pGVar8[iVar10].v.uData[3] = dVar3;
          break;
        case TEXTURECHANNELCLASS_SIGNED_INTEGER:
          iVar7 = this->m_drawBufferNdx;
          uVar12 = iVar7 + 4;
          if (-1 < (int)(iVar7 + 1U)) {
            uVar12 = iVar7 + 1U;
          }
          uVar13 = iVar7 + 5;
          if (-1 < (int)(iVar7 + 2U)) {
            uVar13 = iVar7 + 2U;
          }
          uVar14 = iVar7 + 6;
          if (-1 < (int)(iVar7 + 3U)) {
            uVar14 = iVar7 + 3U;
          }
          fVar4 = *(float *)(local_58 + (long)(int)((iVar7 - (uVar14 & 0xfffffffc)) + 3) * 4);
          fVar5 = *(float *)(local_58 + (long)(int)((iVar7 - (uVar13 & 0xfffffffc)) + 2) * 4);
          fVar6 = *(float *)(local_58 + (long)(int)((iVar7 - (uVar12 & 0xfffffffc)) + 1) * 4);
          pGVar8 = context->outputArray + (iVar11 + fragNdx_00) * context->numFragmentOutputs;
          (pGVar8->v).uData[0] = (int)*(float *)(local_58 + (long)(iVar7 % 4) * 4);
          (pGVar8->v).uData[1] = (int)fVar6;
          (pGVar8->v).uData[2] = (int)fVar5;
          (pGVar8->v).uData[3] = (int)fVar4;
          break;
        case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
          iVar7 = this->m_drawBufferNdx;
          uVar12 = iVar7 + 4;
          if (-1 < (int)(iVar7 + 1U)) {
            uVar12 = iVar7 + 1U;
          }
          uVar13 = iVar7 + 5;
          if (-1 < (int)(iVar7 + 2U)) {
            uVar13 = iVar7 + 2U;
          }
          uVar14 = iVar7 + 6;
          if (-1 < (int)(iVar7 + 3U)) {
            uVar14 = iVar7 + 3U;
          }
          fVar4 = *(float *)(local_58 + (long)(int)((iVar7 - (uVar14 & 0xfffffffc)) + 3) * 4);
          fVar5 = *(float *)(local_58 + (long)(int)((iVar7 - (uVar13 & 0xfffffffc)) + 2) * 4);
          fVar6 = *(float *)(local_58 + (long)(int)((iVar7 - (uVar12 & 0xfffffffc)) + 1) * 4);
          uVar12 = (uint)*(float *)(local_58 + (long)(iVar7 % 4) * 4);
          uVar13 = (uint)fVar6;
          uVar14 = (uint)fVar5;
          uVar15 = (uint)fVar4;
          pGVar8 = context->outputArray + (iVar11 + fragNdx_00) * context->numFragmentOutputs;
          (pGVar8->v).uData[0] =
               (int)(*(float *)(local_58 + (long)(iVar7 % 4) * 4) - 2.1474836e+09) &
               (int)uVar12 >> 0x1f | uVar12;
          (pGVar8->v).uData[1] = (int)(fVar6 - 2.1474836e+09) & (int)uVar13 >> 0x1f | uVar13;
          (pGVar8->v).uData[2] = (int)(fVar5 - 2.1474836e+09) & (int)uVar14 >> 0x1f | uVar14;
          (pGVar8->v).uData[3] = (int)(fVar4 - 2.1474836e+09) & (int)uVar15 >> 0x1f | uVar15;
        }
        fragNdx_00 = fragNdx_00 + 1;
      } while (fragNdx_00 != 4);
      local_38 = local_38 + 1;
      iVar11 = iVar11 + 4;
    } while (local_38 != local_48);
  }
  return;
}

Assistant:

void FragmentShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		rr::FragmentPacket& packet = packets[packetNdx];

		DE_ASSERT(m_drawBufferNdx >= 0);
		DE_UNREF(m_info);

		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		{
			const Vec2	vColor		= rr::readVarying<float>(packet, context, 0, fragNdx).xy();
			const float	values[]	=
			{
				vColor.x(),
				vColor.y(),
				(1.0f - vColor.x()),
				(1.0f - vColor.y())
			};

			switch (tcu::getTextureChannelClass(m_info.getFormat().type))
			{
				case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
				case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
				case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
				{
					const Vec4 color (values[(m_drawBufferNdx + 0) % 4],
									  values[(m_drawBufferNdx + 1) % 4],
									  values[(m_drawBufferNdx + 2) % 4],
									  values[(m_drawBufferNdx + 3) % 4]);

					rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
					break;
				}

				case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
				{
					const UVec4 color ((deUint32)(values[(m_drawBufferNdx + 0) % 4]),
									   (deUint32)(values[(m_drawBufferNdx + 1) % 4]),
									   (deUint32)(values[(m_drawBufferNdx + 2) % 4]),
									   (deUint32)(values[(m_drawBufferNdx + 3) % 4]));

					rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
					break;
				}

				case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
				{
					const IVec4 color ((deInt32)(values[(m_drawBufferNdx + 0) % 4]),
									   (deInt32)(values[(m_drawBufferNdx + 1) % 4]),
									   (deInt32)(values[(m_drawBufferNdx + 2) % 4]),
									   (deInt32)(values[(m_drawBufferNdx + 3) % 4]));

					rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
					break;
				}

				default:
					DE_ASSERT(DE_FALSE);
			};
		}
	}
}